

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O0

void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx,uchar *seed32)

{
  int flag;
  undefined8 *in_RSI;
  long in_RDI;
  uchar keydata [64];
  secp256k1_rfc6979_hmac_sha256 rng;
  uchar nonce32 [32];
  secp256k1_fe f;
  secp256k1_gej gb;
  secp256k1_scalar diff;
  secp256k1_scalar b;
  secp256k1_ge *in_stack_fffffffffffffe58;
  secp256k1_ge *in_stack_fffffffffffffe60;
  secp256k1_scalar *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  secp256k1_scalar *a;
  secp256k1_scalar *in_stack_fffffffffffffe80;
  secp256k1_scalar *r;
  secp256k1_scalar *in_stack_fffffffffffffe88;
  secp256k1_scalar *a_00;
  secp256k1_scalar *in_stack_fffffffffffffe90;
  secp256k1_scalar *r_00;
  secp256k1_gej *in_stack_fffffffffffffea8;
  secp256k1_ge *in_stack_fffffffffffffeb0;
  uchar local_118 [32];
  undefined1 local_f8 [24];
  size_t in_stack_ffffffffffffff20;
  uchar *in_stack_ffffffffffffff28;
  secp256k1_rfc6979_hmac_sha256 *in_stack_ffffffffffffff30;
  secp256k1_scalar *in_stack_ffffffffffffff90;
  secp256k1_gej *in_stack_ffffffffffffff98;
  secp256k1_ecmult_gen_context *in_stack_ffffffffffffffa0;
  
  secp256k1_ecmult_gen_scalar_diff(in_stack_fffffffffffffe80);
  if (in_RSI == (undefined8 *)0x0) {
    secp256k1_ge_neg(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    secp256k1_scalar_add
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    memcpy((void *)(in_RDI + 0x80),&secp256k1_fe_one,0x28);
  }
  else {
    secp256k1_scalar_get_b32
              ((uchar *)in_stack_fffffffffffffe60,(secp256k1_scalar *)in_stack_fffffffffffffe58);
    a = (secp256k1_scalar *)*in_RSI;
    r = (secp256k1_scalar *)in_RSI[1];
    a_00 = (secp256k1_scalar *)in_RSI[2];
    r_00 = (secp256k1_scalar *)in_RSI[3];
    secp256k1_rfc6979_hmac_sha256_initialize
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    secp256k1_memclear(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)keydata._16_8_,(uchar *)keydata._8_8_,keydata._0_8_)
    ;
    secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)local_f8,local_118);
    flag = secp256k1_fe_impl_normalizes_to_zero((secp256k1_fe *)local_f8);
    secp256k1_fe_impl_cmov((secp256k1_fe *)local_f8,&secp256k1_fe_one,flag);
    memcpy((void *)(in_RDI + 0x80),local_f8,0x28);
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)keydata._16_8_,(uchar *)keydata._8_8_,keydata._0_8_)
    ;
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (uchar *)in_stack_fffffffffffffe68,(int *)in_stack_fffffffffffffe60);
    secp256k1_scalar_is_zero((secp256k1_scalar *)0x105ad7);
    secp256k1_scalar_cmov(r,a,in_stack_fffffffffffffe74);
    secp256k1_rfc6979_hmac_sha256_finalize
              ((secp256k1_rfc6979_hmac_sha256 *)&stack0xfffffffffffffea4);
    secp256k1_ecmult_gen
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    secp256k1_scalar_negate
              ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68);
    secp256k1_scalar_add(r_00,a_00,r);
    secp256k1_ge_set_gej(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    secp256k1_memclear(in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58);
    secp256k1_scalar_clear((secp256k1_scalar *)0x105b7d);
    secp256k1_gej_clear((secp256k1_gej *)0x105b8a);
    secp256k1_fe_clear((secp256k1_fe *)0x105b97);
    secp256k1_rfc6979_hmac_sha256_clear((secp256k1_rfc6979_hmac_sha256 *)0x105ba1);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_gen_blind(secp256k1_ecmult_gen_context *ctx, const unsigned char *seed32) {
    secp256k1_scalar b;
    secp256k1_scalar diff;
    secp256k1_gej gb;
    secp256k1_fe f;
    unsigned char nonce32[32];
    secp256k1_rfc6979_hmac_sha256 rng;
    unsigned char keydata[64];

    /* Compute the (2^COMB_BITS - 1)/2 term once. */
    secp256k1_ecmult_gen_scalar_diff(&diff);

    if (seed32 == NULL) {
        /* When seed is NULL, reset the final point and blinding value. */
        secp256k1_ge_neg(&ctx->ge_offset, &secp256k1_ge_const_g);
        secp256k1_scalar_add(&ctx->scalar_offset, &secp256k1_scalar_one, &diff);
        ctx->proj_blind = secp256k1_fe_one;
        return;
    }
    /* The prior blinding value (if not reset) is chained forward by including it in the hash. */
    secp256k1_scalar_get_b32(keydata, &ctx->scalar_offset);
    /** Using a CSPRNG allows a failure free interface, avoids needing large amounts of random data,
     *   and guards against weak or adversarial seeds.  This is a simpler and safer interface than
     *   asking the caller for blinding values directly and expecting them to retry on failure.
     */
    VERIFY_CHECK(seed32 != NULL);
    memcpy(keydata + 32, seed32, 32);
    secp256k1_rfc6979_hmac_sha256_initialize(&rng, keydata, 64);
    secp256k1_memclear(keydata, sizeof(keydata));

    /* Compute projective blinding factor (cannot be 0). */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_fe_set_b32_mod(&f, nonce32);
    secp256k1_fe_cmov(&f, &secp256k1_fe_one, secp256k1_fe_normalizes_to_zero(&f));
    ctx->proj_blind = f;

    /* For a random blinding value b, set scalar_offset=diff-b, ge_offset=bG */
    secp256k1_rfc6979_hmac_sha256_generate(&rng, nonce32, 32);
    secp256k1_scalar_set_b32(&b, nonce32, NULL);
    /* The blinding value cannot be zero, as that would mean ge_offset = infinity,
     * which secp256k1_gej_add_ge cannot handle. */
    secp256k1_scalar_cmov(&b, &secp256k1_scalar_one, secp256k1_scalar_is_zero(&b));
    secp256k1_rfc6979_hmac_sha256_finalize(&rng);
    secp256k1_ecmult_gen(ctx, &gb, &b);
    secp256k1_scalar_negate(&b, &b);
    secp256k1_scalar_add(&ctx->scalar_offset, &b, &diff);
    secp256k1_ge_set_gej(&ctx->ge_offset, &gb);

    /* Clean up. */
    secp256k1_memclear(nonce32, sizeof(nonce32));
    secp256k1_scalar_clear(&b);
    secp256k1_gej_clear(&gb);
    secp256k1_fe_clear(&f);
    secp256k1_rfc6979_hmac_sha256_clear(&rng);
}